

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

ScriptBuilder * __thiscall
cfd::core::ScriptBuilder::AppendString(ScriptBuilder *this,string *message)

{
  uint __val;
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  uint __len;
  string str;
  string local_98;
  ByteData local_78;
  ScriptOperator local_60;
  
  bVar2 = ScriptOperator::IsValid(message);
  if (bVar2) {
    ScriptOperator::Get(&local_60,message);
    AppendOperator(this,&local_60);
    local_60._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_0069ba80;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.text_data_._M_dataplus._M_p == &local_60.text_data_.field_2) {
      return this;
    }
  }
  else {
    if (message->_M_string_length < 3) {
      bVar2 = false;
    }
    else {
      ::std::__cxx11::string::substr((ulong)&local_60,(ulong)message);
      iVar3 = ::std::__cxx11::string::compare((char *)&local_60);
      bVar2 = iVar3 == 0;
      if ((string *)local_60._vptr_ScriptOperator != &local_60.text_data_) {
        operator_delete(local_60._vptr_ScriptOperator);
      }
    }
    if (bVar2) {
      ::std::__cxx11::string::substr((ulong)&local_98,(ulong)message);
      ByteData::ByteData(&local_78,&local_98);
      AppendData(this,&local_78);
      if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      local_60.text_data_._M_dataplus._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return this;
      }
    }
    else {
      uVar4 = atoi((message->_M_dataplus)._M_p);
      if (uVar4 != 0) {
        __val = -uVar4;
        if (0 < (int)uVar4) {
          __val = uVar4;
        }
        __len = 1;
        if (9 < __val) {
          uVar6 = (ulong)__val;
          uVar1 = 4;
          do {
            __len = uVar1;
            uVar5 = (uint)uVar6;
            if (uVar5 < 100) {
              __len = __len - 2;
              goto LAB_00416661;
            }
            if (uVar5 < 1000) {
              __len = __len - 1;
              goto LAB_00416661;
            }
            if (uVar5 < 10000) goto LAB_00416661;
            uVar6 = uVar6 / 10000;
            uVar1 = __len + 4;
          } while (99999 < uVar5);
          __len = __len + 1;
        }
LAB_00416661:
        local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
        ::std::__cxx11::string::_M_construct
                  ((ulong)&local_98,(char)__len - (char)((int)uVar4 >> 0x1f));
        ::std::__detail::__to_chars_10_impl<unsigned_int>
                  (local_98._M_dataplus._M_p + (uVar4 >> 0x1f),__len,__val);
        if (local_98._M_string_length == message->_M_string_length) {
          if (local_98._M_string_length == 0) {
            bVar2 = true;
          }
          else {
            iVar3 = bcmp(local_98._M_dataplus._M_p,(message->_M_dataplus)._M_p,
                         local_98._M_string_length);
            bVar2 = iVar3 == 0;
          }
        }
        else {
          bVar2 = false;
        }
        if (bVar2) {
          local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)(long)(int)uVar4;
          AppendData(this,(int64_t *)&local_78);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p);
        }
        if (bVar2) {
          return this;
        }
      }
      ByteData::ByteData((ByteData *)&local_98,message);
      AppendData(this,(ByteData *)&local_98);
      local_60.text_data_._M_dataplus._M_p = local_98._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        return this;
      }
    }
  }
  operator_delete(local_60.text_data_._M_dataplus._M_p);
  return this;
}

Assistant:

ScriptBuilder& ScriptBuilder::AppendString(const std::string& message) {
  if (ScriptOperator::IsValid(message)) {
    return AppendOperator(ScriptOperator::Get(message));
  } else if ((message.length() > 2) && (message.substr(0, 2) == "0x")) {
    // to hex
    return AppendData(ByteData(message.substr(2)));
  } else {
    if (std::atoi(message.c_str()) != 0) {  // check number
      int int_value = std::atoi(message.c_str());
      std::string str = std::to_string(int_value);
      if (str == message) {
        return AppendData(static_cast<int64_t>(int_value));
      }
    }
    // hex string check (force)
    return AppendData(ByteData(message));
  }
}